

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

JavascriptString *
Js::LiteralStringWithPropertyStringPtr::NewFromWideString
          (char16 *wideString,CharCount charCount,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  LiteralStringWithPropertyStringPtr *this;
  JavascriptString *pJVar5;
  Recycler *pRVar6;
  ulong sizeInWords;
  char16 *dst;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  if (wideString == (char16 *)0x0 || library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x20,"(library != nullptr && wideString != nullptr)",
                                "library != nullptr && wideString != nullptr");
    if (!bVar2) goto LAB_00b3bb6a;
    *puVar4 = 0;
  }
  if (charCount == 1) {
    pJVar5 = CharStringCache::GetStringForChar(&library->charStringCache,*wideString);
    return pJVar5;
  }
  if (charCount == 0) {
    this = (LiteralStringWithPropertyStringPtr *)JavascriptLibrary::GetEmptyString(library);
    if ((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
        (_func_int **)VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::Address) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                  ,0x28,
                                  "(VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::HasVirtualTable(emptyString))"
                                  ,
                                  "Library::GetEmptyString is no longer LiteralStringWithPropertyStringPtr ?"
                                 );
      if (!bVar2) {
LAB_00b3bb6a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    data._32_8_ = (library->super_JavascriptLibraryBase).scriptContext.ptr;
    local_68 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_6186192;
    data.filename._0_4_ = 0x35;
    data.plusSize = (ulong)(charCount + 1);
    pRVar6 = Memory::Recycler::TrackAllocInfo(library->recycler,(TrackAllocData *)local_68);
    if (charCount == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
      dst = (char16 *)&DAT_00000008;
    }
    else {
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b3bb6a;
        *puVar4 = 0;
      }
      dst = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar6,(ulong)(charCount + 1) * 2);
      if (dst == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00b3bb6a;
        *puVar4 = 0;
      }
    }
    if (dst == (char16 *)0x0) {
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)data._32_8_);
    }
    sizeInWords = (ulong)charCount;
    js_wmemcpy_s(dst,sizeInWords,wideString,sizeInWords);
    dst[sizeInWords] = L'\0';
    local_68 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_6186192;
    data.filename._0_4_ = 0x3f;
    pRVar6 = Memory::Recycler::TrackAllocInfo(library->recycler,(TrackAllocData *)local_68);
    this = (LiteralStringWithPropertyStringPtr *)new<Memory::Recycler>(0x30,pRVar6,0x38bbb2);
    LiteralStringWithPropertyStringPtr(this,dst,charCount,library);
  }
  return (JavascriptString *)this;
}

Assistant:

JavascriptString * LiteralStringWithPropertyStringPtr::
    NewFromWideString(const char16 * wideString, const CharCount charCount, JavascriptLibrary *const library)
    {
        Assert(library != nullptr && wideString != nullptr);

        switch (charCount)
        {
            case 0:
            {
                JavascriptString * emptyString = library->GetEmptyString();
                AssertMsg(VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::HasVirtualTable(emptyString),
                    "Library::GetEmptyString is no longer LiteralStringWithPropertyStringPtr ?");
                return emptyString;
            }
            case 1:
            {
                return library->GetCharStringCache().GetStringForChar((char16(*wideString)));
            }
            default:
                break;
        }

        Recycler * recycler = library->GetRecycler();
        ScriptContext * scriptContext = library->GetScriptContext();
        char16* destString = RecyclerNewArrayLeaf(recycler, WCHAR, charCount + 1);

        if (destString == nullptr)
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        js_wmemcpy_s(destString, charCount, wideString, charCount);
        destString[charCount] = char16(0);

        return (JavascriptString*) RecyclerNew(library->GetRecycler(), LiteralStringWithPropertyStringPtr, destString, charCount, library);
    }